

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::Build_Function_Caller_Helper<int,int>::box<int,int>
          (Build_Function_Caller_Helper<int,int> *this,int *q)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  int *q_local;
  
  Boxed_Value::Boxed_Value<int,void>((Boxed_Value *)this,q,false);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value box(Q &&q) {
      if constexpr (std::is_same_v<chaiscript::Boxed_Value, std::decay_t<Q>>) {
        return std::forward<Q>(q);
      } else if constexpr (std::is_reference_v<P>) {
        return Boxed_Value(std::ref(std::forward<Q>(q)));
      } else {
        return Boxed_Value(std::forward<Q>(q));
      }
    }